

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderMatrixTests.cpp
# Opt level: O3

void deqp::gles2::Functional::MatrixCaseUtils::Evaluator<13,_0,_5,_2,_5>::evaluate
               (ShaderEvalContext *evalCtx)

{
  bool bVar1;
  long lVar2;
  bool bVar3;
  bool bVar4;
  undefined8 *puVar5;
  float *pfVar6;
  bool bVar7;
  Vector<float,_2> *pVVar8;
  long lVar9;
  float v;
  float fVar10;
  float local_78 [5];
  float local_64 [3];
  Matrix<float,_2,_2> res;
  undefined1 local_48 [8];
  undefined8 uStack_40;
  Mat2 m;
  
  local_48 = (undefined1  [8])s_constInMat2;
  uStack_40 = DAT_0078b358;
  res.m_data.m_data[0].m_data[0] = evalCtx->in[0].m_data[0];
  res.m_data.m_data[0].m_data[1] = evalCtx->in[0].m_data[1];
  res.m_data.m_data[1].m_data[0] = evalCtx->in[1].m_data[0];
  res.m_data.m_data[1].m_data[1] = evalCtx->in[1].m_data[1];
  local_78[0] = 1.0;
  local_78[1] = 0.0;
  local_78[2] = 0.0;
  local_78[3] = 1.0;
  puVar5 = (undefined8 *)local_48;
  pfVar6 = local_78;
  bVar1 = true;
  do {
    bVar4 = bVar1;
    lVar2 = 0;
    pVVar8 = (Vector<float,_2> *)&res;
    bVar1 = true;
    do {
      bVar7 = bVar1;
      fVar10 = 0.0;
      lVar9 = 0;
      bVar1 = true;
      do {
        bVar3 = bVar1;
        fVar10 = fVar10 + *(float *)(puVar5 + lVar9) * pVVar8->m_data[lVar9];
        lVar9 = 1;
        bVar1 = false;
      } while (bVar3);
      pfVar6[lVar2 * 2] = fVar10;
      lVar2 = 1;
      pVVar8 = res.m_data.m_data + 1;
      bVar1 = false;
    } while (bVar7);
    puVar5 = (undefined8 *)((long)local_48 + 4);
    pfVar6 = local_78 + 1;
    bVar1 = false;
  } while (bVar4);
  local_64[0] = local_78[0];
  local_64[1] = local_78[2];
  local_64[2] = local_78[1] + local_78[3];
  m.m_data.m_data[1].m_data[0] = 0.0;
  m.m_data.m_data[1].m_data[1] = 1.4013e-45;
  lVar2 = 2;
  do {
    (evalCtx->color).m_data[(int)m.m_data.m_data[0].m_data[lVar2]] = local_78[lVar2 + 3];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 5);
  return;
}

Assistant:

inline tcu::Mat4 getInputValue<INPUTTYPE_DYNAMIC, TYPE_FLOAT_MAT4> (const ShaderEvalContext& evalCtx, int inputNdx)
{
	DE_UNREF(inputNdx); // Not used.
	tcu::Mat4 m;
	m.setColumn(0, evalCtx.in[0]);
	m.setColumn(1, evalCtx.in[1]);
	m.setColumn(2, evalCtx.in[2]);
	m.setColumn(3, evalCtx.in[3]);
	return m;
}